

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int memdbWrite(sqlite3_file *pFile,void *z,int iAmt,sqlite_int64 iOfst)

{
  long lVar1;
  sqlite3_io_methods *psVar2;
  long lVar3;
  bool bVar4;
  _func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *p_Var5;
  int iVar6;
  _func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *nBytes;
  sqlite3_mutex *psVar7;
  size_t __n;
  
  psVar2 = pFile[1].pMethods;
  if ((sqlite3_mutex *)psVar2->xTruncate != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar2->xTruncate);
  }
  if (((ulong)psVar2->xSync & 0x400000000) != 0) {
    psVar7 = (sqlite3_mutex *)psVar2->xTruncate;
    iVar6 = 0x30a;
    goto LAB_001292b5;
  }
  __n = (size_t)iAmt;
  lVar1 = __n + iOfst;
  if (*(long *)psVar2 < lVar1) {
    if ((long)psVar2->xClose < lVar1) {
      iAmt = 0xd;
      if (((((ulong)psVar2->xSync & 0x200000000) == 0) || (0 < *(int *)&psVar2->xSync)) ||
         (nBytes = psVar2->xRead, (long)nBytes < lVar1)) {
LAB_00129263:
        bVar4 = false;
      }
      else {
        if (lVar1 * 2 < (long)nBytes) {
          nBytes = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)(lVar1 * 2);
        }
        p_Var5 = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)
                 sqlite3Realloc(psVar2->xWrite,(u64)nBytes);
        iAmt = 0;
        if (p_Var5 == (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0) {
          iAmt = 0xc0a;
          goto LAB_00129263;
        }
        psVar2->xWrite = p_Var5;
        psVar2->xClose = (_func_int_sqlite3_file_ptr *)nBytes;
        bVar4 = true;
      }
      if (bVar4) goto LAB_00129269;
      if ((sqlite3_mutex *)psVar2->xTruncate != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)psVar2->xTruncate);
      }
      bVar4 = false;
    }
    else {
LAB_00129269:
      lVar3 = *(long *)psVar2;
      if (iOfst - lVar3 != 0 && lVar3 <= iOfst) {
        memset(psVar2->xWrite + lVar3,0,iOfst - lVar3);
      }
      *(long *)psVar2 = lVar1;
      bVar4 = true;
    }
    if (!bVar4) {
      return iAmt;
    }
  }
  memcpy(psVar2->xWrite + iOfst,z,__n);
  psVar7 = (sqlite3_mutex *)psVar2->xTruncate;
  iVar6 = 0;
LAB_001292b5:
  if (psVar7 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar7);
  }
  return iVar6;
}

Assistant:

static int memdbWrite(
  sqlite3_file *pFile,
  const void *z,
  int iAmt,
  sqlite_int64 iOfst
){
  MemStore *p = ((MemFile*)pFile)->pStore;
  memdbEnter(p);
  if( NEVER(p->mFlags & SQLITE_DESERIALIZE_READONLY) ){
    /* Can't happen: memdbLock() will return SQLITE_READONLY before
    ** reaching this point */
    memdbLeave(p);
    return SQLITE_IOERR_WRITE;
  }
  if( iOfst+iAmt>p->sz ){
    int rc;
    if( iOfst+iAmt>p->szAlloc
     && (rc = memdbEnlarge(p, iOfst+iAmt))!=SQLITE_OK
    ){
      memdbLeave(p);
      return rc;
    }
    if( iOfst>p->sz ) memset(p->aData+p->sz, 0, iOfst-p->sz);
    p->sz = iOfst+iAmt;
  }
  memcpy(p->aData+iOfst, z, iAmt);
  memdbLeave(p);
  return SQLITE_OK;
}